

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPExternalTransmitter::Init(RTPExternalTransmitter *this,bool tsafe)

{
  int iVar1;
  
  iVar1 = -2;
  if (this->init != false) {
    iVar1 = -0x8c;
  }
  if (!tsafe && this->init == false) {
    this->init = true;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPExternalTransmitter::Init(bool tsafe)
{
	if (init)
		return ERR_RTP_EXTERNALTRANS_ALREADYINIT;
	
#ifdef RTP_SUPPORT_THREAD
	threadsafe = tsafe;
	if (threadsafe)
	{
		int status;
		
		status = mainmutex.Init();
		if (status < 0)
			return ERR_RTP_EXTERNALTRANS_CANTINITMUTEX;
		status = waitmutex.Init();
		if (status < 0)
			return ERR_RTP_EXTERNALTRANS_CANTINITMUTEX;
	}
#else
	if (tsafe)
		return ERR_RTP_NOTHREADSUPPORT;
#endif // RTP_SUPPORT_THREAD

	init = true;
	return 0;
}